

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseAssembler::embedLabel(BaseAssembler *this,Label *label,size_t dataSize)

{
  uint uVar1;
  CodeHolder *pCVar2;
  LabelEntry *le;
  Logger *pLVar3;
  Error EVar4;
  LabelEntry **ppLVar5;
  ulong uVar6;
  LabelLink *pLVar7;
  undefined1 *puVar8;
  ulong n;
  Error EStack_170;
  CodeWriter writer;
  OffsetFormat of;
  RelocEntry *re;
  ulong uStack_150;
  undefined8 local_148;
  undefined1 *local_140;
  undefined1 local_138 [264];
  
  pCVar2 = (this->super_BaseEmitter)._code;
  if (pCVar2 == (CodeHolder *)0x0) {
    EStack_170 = 5;
    goto LAB_0010e6c0;
  }
  uVar1 = (label->super_Operand).super_Operand_._baseId;
  if (uVar1 < *(uint *)&pCVar2->field_0x100) {
    ppLVar5 = ZoneVector<asmjit::v1_14::LabelEntry_*>::operator[]
                        (&pCVar2->_labelEntries,(ulong)uVar1);
    le = *ppLVar5;
    if (le != (LabelEntry *)0x0) {
      n = (ulong)(((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * 4 + 4;
      if (dataSize != 0) {
        n = dataSize;
      }
      if ((8 < n) ||
         (uVar6 = n - (n >> 1 & 0x5555555555555555),
         uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333),
         1 < (byte)(((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38))) {
        EStack_170 = 0x33;
        goto LAB_0010e6c0;
      }
      writer._cursor = this->_bufferPtr;
      EVar4 = CodeWriter::ensureSpace(&writer,this,n);
      if (EVar4 != 0) {
        return EVar4;
      }
      if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
        local_140 = local_138;
        uStack_150 = 0;
        re = (RelocEntry *)0x20;
        local_148 = 0x107;
        local_138[0] = 0;
        String::_opChar((String *)&re,kAppend,'.');
        Formatter::formatDataType
                  ((String *)&re,(((this->super_BaseEmitter)._logger)->_options)._flags,
                   (this->super_BaseEmitter)._environment._arch,dataTypeIdBySize[n]);
        String::_opChar((String *)&re,kAppend,' ');
        Formatter::formatLabel
                  ((String *)&re,kNone,&this->super_BaseEmitter,
                   (label->super_Operand).super_Operand_._baseId);
        String::_opChar((String *)&re,kAppend,'\n');
        pLVar3 = (this->super_BaseEmitter)._logger;
        uVar6 = uStack_150;
        puVar8 = local_140;
        if (((ulong)re & 0xff) < 0x1f) {
          uVar6 = (ulong)re & 0xff;
          puVar8 = (undefined1 *)((long)&re + 1);
        }
        (*pLVar3->_vptr_Logger[2])(pLVar3,puVar8,uVar6);
        String::reset((String *)&re);
      }
      EVar4 = CodeHolder::newRelocEntry((this->super_BaseEmitter)._code,&re,kRelToAbs);
      if (EVar4 == 0) {
        re->_sourceSectionId = this->_section->_id;
        re->_sourceOffset = (long)this->_bufferPtr - (long)this->_bufferData;
        OffsetFormat::resetToSimpleValue(&re->_format,kUnsignedOffset,n);
        if (le->_section == (Section *)0x0) {
          OffsetFormat::resetToSimpleValue(&of,kUnsignedOffset,n);
          pLVar7 = CodeHolder::newLabelLink
                             ((this->super_BaseEmitter)._code,le,this->_section->_id,
                              (long)this->_bufferPtr - (long)this->_bufferData,0,&of);
          if (pLVar7 == (LabelLink *)0x0) {
            EVar4 = 1;
            goto LAB_0010e7ea;
          }
          pLVar7->relocId = re->_id;
        }
        else {
          re->_targetSectionId = le->_section->_id;
          re->_payload = le->_offset;
        }
        CodeWriter::emitZeros(&writer,n);
        CodeWriter::done(&writer,this);
        EVar4 = 0;
      }
      else {
LAB_0010e7ea:
        EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar4,(char *)0x0);
      }
      return EVar4;
    }
  }
  EStack_170 = 0xc;
LAB_0010e6c0:
  EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,EStack_170,(char *)0x0);
  return EVar4;
}

Assistant:

Error BaseAssembler::embedLabel(const Label& label, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  ASMJIT_ASSERT(_code != nullptr);
  RelocEntry* re;
  LabelEntry* le = _code->labelEntry(label);

  if (ASMJIT_UNLIKELY(!le))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  if (dataSize == 0)
    dataSize = registerSize();

  if (ASMJIT_UNLIKELY(!Support::isPowerOf2(dataSize) || dataSize > 8))
    return reportError(DebugUtils::errored(kErrorInvalidOperandSize));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<256> sb;
    sb.append('.');
    Formatter::formatDataType(sb, _logger->flags(), arch(), dataTypeIdBySize[dataSize]);
    sb.append(' ');
    Formatter::formatLabel(sb, FormatFlags::kNone, this, label.id());
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  Error err = _code->newRelocEntry(&re, RelocType::kRelToAbs);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  re->_sourceSectionId = _section->id();
  re->_sourceOffset = offset();
  re->_format.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

  if (le->isBound()) {
    re->_targetSectionId = le->section()->id();
    re->_payload = le->offset();
  }
  else {
    OffsetFormat of;
    of.resetToSimpleValue(OffsetType::kUnsignedOffset, dataSize);

    LabelLink* link = _code->newLabelLink(le, _section->id(), offset(), 0, of);
    if (ASMJIT_UNLIKELY(!link))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));

    link->relocId = re->id();
  }

  // Emit dummy DWORD/QWORD depending on the data size.
  writer.emitZeros(dataSize);
  writer.done(this);

  return kErrorOk;
}